

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Array<kj::String> * __thiscall
kj::anon_unknown_8::DiskHandle::listNames
          (Array<kj::String> *__return_storage_ptr__,DiskHandle *this)

{
  anon_class_1_0_00000001 local_19;
  DiskHandle *local_18;
  DiskHandle *this_local;
  
  local_18 = this;
  this_local = (DiskHandle *)__return_storage_ptr__;
  (anonymous_namespace)::DiskHandle::
  list<kj::(anonymous_namespace)::DiskHandle::listNames()const::_lambda(kj::StringPtr,kj::FsNode::Type)_1_>
            (__return_storage_ptr__,this,false,&local_19);
  return __return_storage_ptr__;
}

Assistant:

Array<String> listNames() const {
    return list(false, [](StringPtr name, FsNode::Type type) { return heapString(name); });
  }